

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertbmp.c
# Opt level: O3

opj_image_t * bmptoimage(char *filename,opj_cparameters_t *parameters)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  OPJ_UINT32 OVar6;
  int iVar7;
  FILE *__stream;
  size_t sVar8;
  OPJ_UINT8 *pData;
  long lVar9;
  opj_image_t *image;
  OPJ_UINT32 OVar10;
  undefined8 in_R8;
  OPJ_UINT32 OVar11;
  char cVar12;
  ulong uVar13;
  byte bVar14;
  uint uVar15;
  OPJ_UINT32 OVar16;
  OPJ_BITMAPINFOHEADER Info_h;
  OPJ_UINT8 *pLUT [3];
  undefined8 uStack_3d0;
  opj_image_cmptparm_t cmptparm [4];
  OPJ_UINT8 lut_B [256];
  OPJ_UINT8 lut_G [256];
  OPJ_UINT8 lut_R [256];
  
  pLUT[0] = lut_R;
  pLUT[1] = lut_G;
  pLUT[2] = lut_B;
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"Failed to open %s for reading !!\n",filename);
    return (opj_image_t *)0x0;
  }
  uVar2 = getc(__stream);
  iVar3 = getc(__stream);
  if (((iVar3 << 8 | uVar2) & 0xffff) != 0x4d42) {
    bmptoimage_cold_1();
    return (opj_image_t *)0x0;
  }
  getc(__stream);
  getc(__stream);
  getc(__stream);
  getc(__stream);
  getc(__stream);
  getc(__stream);
  getc(__stream);
  getc(__stream);
  uVar2 = getc(__stream);
  iVar3 = getc(__stream);
  iVar4 = getc(__stream);
  iVar5 = getc(__stream);
  Info_h.biSize = 0;
  Info_h.biWidth = 0;
  Info_h.biHeight = 0;
  Info_h.biPlanes = 0;
  Info_h.biBitCount = 0;
  Info_h.biCompression = 0;
  Info_h.biSizeImage = 0;
  Info_h.biXpelsPerMeter = 0;
  Info_h.biYpelsPerMeter = 0;
  Info_h.biClrUsed = 0;
  Info_h.biClrImportant = 0;
  Info_h.biRedMask = 0;
  Info_h.biGreenMask = 0;
  Info_h.biBlueMask = 0;
  Info_h.biAlphaMask = 0;
  Info_h.biColorSpaceType = 0;
  Info_h.biColorSpaceEP[0] = '\0';
  Info_h.biColorSpaceEP[1] = '\0';
  Info_h.biColorSpaceEP[2] = '\0';
  Info_h.biColorSpaceEP[3] = '\0';
  Info_h.biColorSpaceEP[4] = '\0';
  Info_h.biColorSpaceEP[5] = '\0';
  Info_h.biColorSpaceEP[6] = '\0';
  Info_h.biColorSpaceEP[7] = '\0';
  Info_h.biColorSpaceEP[8] = '\0';
  Info_h.biColorSpaceEP[9] = '\0';
  Info_h.biColorSpaceEP[10] = '\0';
  Info_h.biColorSpaceEP[0xb] = '\0';
  Info_h.biColorSpaceEP[0xc] = '\0';
  Info_h.biColorSpaceEP[0xd] = '\0';
  Info_h.biColorSpaceEP[0xe] = '\0';
  Info_h.biColorSpaceEP[0xf] = '\0';
  Info_h.biColorSpaceEP[0x10] = '\0';
  Info_h.biColorSpaceEP[0x11] = '\0';
  Info_h.biColorSpaceEP[0x12] = '\0';
  Info_h.biColorSpaceEP[0x13] = '\0';
  Info_h.biColorSpaceEP[0x14] = '\0';
  Info_h.biColorSpaceEP[0x15] = '\0';
  Info_h.biColorSpaceEP[0x16] = '\0';
  Info_h.biColorSpaceEP[0x17] = '\0';
  Info_h.biColorSpaceEP[0x18] = '\0';
  Info_h.biColorSpaceEP[0x19] = '\0';
  Info_h.biColorSpaceEP[0x1a] = '\0';
  Info_h.biColorSpaceEP[0x1b] = '\0';
  Info_h.biColorSpaceEP[0x1c] = '\0';
  Info_h.biColorSpaceEP[0x1d] = '\0';
  Info_h.biColorSpaceEP[0x1e] = '\0';
  Info_h.biColorSpaceEP[0x1f] = '\0';
  Info_h.biColorSpaceEP[0x20] = '\0';
  Info_h.biColorSpaceEP[0x21] = '\0';
  Info_h.biColorSpaceEP[0x22] = '\0';
  Info_h.biColorSpaceEP[0x23] = '\0';
  Info_h.biRedGamma = 0;
  Info_h.biGreenGamma = 0;
  Info_h.biBlueGamma = 0;
  Info_h.biIntent = 0;
  Info_h.biIccProfileData = 0;
  Info_h.biIccProfileSize = 0;
  Info_h.biReserved = 0;
  OVar6 = getc(__stream);
  Info_h.biSize = OVar6;
  iVar7 = getc(__stream);
  Info_h.biSize = Info_h.biSize | iVar7 << 8;
  iVar7 = getc(__stream);
  Info_h.biSize = Info_h.biSize | iVar7 << 0x10;
  iVar7 = getc(__stream);
  Info_h.biSize = iVar7 << 0x18 | Info_h.biSize;
  if ((((0x38 < Info_h.biSize) || ((0x110010000001000U >> ((ulong)Info_h.biSize & 0x3f) & 1) == 0))
      && (Info_h.biSize != 0x6c)) && (Info_h.biSize != 0x7c)) {
    fprintf(_stderr,"Error, unknown BMP header size %d\n",(ulong)Info_h.biSize);
    goto LAB_0010c346;
  }
  OVar6 = getc(__stream);
  Info_h.biWidth = OVar6;
  iVar7 = getc(__stream);
  Info_h.biWidth = Info_h.biWidth | iVar7 << 8;
  iVar7 = getc(__stream);
  Info_h.biWidth = Info_h.biWidth | iVar7 << 0x10;
  iVar7 = getc(__stream);
  Info_h.biWidth = Info_h.biWidth | iVar7 << 0x18;
  OVar6 = getc(__stream);
  Info_h.biHeight = OVar6;
  iVar7 = getc(__stream);
  Info_h.biHeight = Info_h.biHeight | iVar7 << 8;
  iVar7 = getc(__stream);
  Info_h.biHeight = Info_h.biHeight | iVar7 << 0x10;
  iVar7 = getc(__stream);
  Info_h.biHeight = Info_h.biHeight | iVar7 << 0x18;
  iVar7 = getc(__stream);
  Info_h.biPlanes = (OPJ_UINT16)iVar7;
  iVar7 = getc(__stream);
  Info_h.biPlanes = Info_h.biPlanes | (ushort)(iVar7 << 8);
  iVar7 = getc(__stream);
  Info_h.biBitCount = (OPJ_UINT16)iVar7;
  iVar7 = getc(__stream);
  Info_h.biBitCount = (ushort)(iVar7 << 8) | Info_h.biBitCount;
  if (Info_h.biBitCount == 0) {
    bmptoimage_cold_8();
    goto LAB_0010c346;
  }
  uVar1 = Info_h.biBitCount;
  if (0x27 < Info_h.biSize) {
    OVar6 = getc(__stream);
    Info_h.biCompression = OVar6;
    iVar7 = getc(__stream);
    Info_h.biCompression = Info_h.biCompression | iVar7 << 8;
    iVar7 = getc(__stream);
    Info_h.biCompression = Info_h.biCompression | iVar7 << 0x10;
    iVar7 = getc(__stream);
    Info_h.biCompression = Info_h.biCompression | iVar7 << 0x18;
    OVar6 = getc(__stream);
    Info_h.biSizeImage = OVar6;
    iVar7 = getc(__stream);
    Info_h.biSizeImage = Info_h.biSizeImage | iVar7 << 8;
    iVar7 = getc(__stream);
    Info_h.biSizeImage = Info_h.biSizeImage | iVar7 << 0x10;
    iVar7 = getc(__stream);
    Info_h.biSizeImage = Info_h.biSizeImage | iVar7 << 0x18;
    OVar6 = getc(__stream);
    Info_h.biXpelsPerMeter = OVar6;
    iVar7 = getc(__stream);
    Info_h.biXpelsPerMeter = Info_h.biXpelsPerMeter | iVar7 << 8;
    iVar7 = getc(__stream);
    Info_h.biXpelsPerMeter = Info_h.biXpelsPerMeter | iVar7 << 0x10;
    iVar7 = getc(__stream);
    Info_h.biXpelsPerMeter = Info_h.biXpelsPerMeter | iVar7 << 0x18;
    OVar6 = getc(__stream);
    Info_h.biYpelsPerMeter = OVar6;
    iVar7 = getc(__stream);
    Info_h.biYpelsPerMeter = Info_h.biYpelsPerMeter | iVar7 << 8;
    iVar7 = getc(__stream);
    Info_h.biYpelsPerMeter = Info_h.biYpelsPerMeter | iVar7 << 0x10;
    iVar7 = getc(__stream);
    Info_h.biYpelsPerMeter = Info_h.biYpelsPerMeter | iVar7 << 0x18;
    OVar6 = getc(__stream);
    Info_h.biClrUsed = OVar6;
    iVar7 = getc(__stream);
    Info_h.biClrUsed = Info_h.biClrUsed | iVar7 << 8;
    iVar7 = getc(__stream);
    Info_h.biClrUsed = Info_h.biClrUsed | iVar7 << 0x10;
    iVar7 = getc(__stream);
    Info_h.biClrUsed = Info_h.biClrUsed | iVar7 << 0x18;
    OVar6 = getc(__stream);
    Info_h.biClrImportant = OVar6;
    iVar7 = getc(__stream);
    Info_h.biClrImportant = Info_h.biClrImportant | iVar7 << 8;
    iVar7 = getc(__stream);
    Info_h.biClrImportant = Info_h.biClrImportant | iVar7 << 0x10;
    iVar7 = getc(__stream);
    Info_h.biClrImportant = Info_h.biClrImportant | iVar7 << 0x18;
    if (0x37 < Info_h.biSize) {
      OVar6 = getc(__stream);
      Info_h.biRedMask = OVar6;
      iVar7 = getc(__stream);
      Info_h.biRedMask = Info_h.biRedMask | iVar7 << 8;
      iVar7 = getc(__stream);
      Info_h.biRedMask = Info_h.biRedMask | iVar7 << 0x10;
      iVar7 = getc(__stream);
      Info_h.biRedMask = Info_h.biRedMask | iVar7 << 0x18;
      if (Info_h.biRedMask == 0) {
        bmptoimage_cold_7();
        goto LAB_0010c346;
      }
      OVar6 = getc(__stream);
      Info_h.biGreenMask = OVar6;
      iVar7 = getc(__stream);
      Info_h.biGreenMask = Info_h.biGreenMask | iVar7 << 8;
      iVar7 = getc(__stream);
      Info_h.biGreenMask = Info_h.biGreenMask | iVar7 << 0x10;
      iVar7 = getc(__stream);
      Info_h.biGreenMask = Info_h.biGreenMask | iVar7 << 0x18;
      if (Info_h.biGreenMask == 0) {
        bmptoimage_cold_6();
        goto LAB_0010c346;
      }
      OVar6 = getc(__stream);
      Info_h.biBlueMask = OVar6;
      iVar7 = getc(__stream);
      Info_h.biBlueMask = Info_h.biBlueMask | iVar7 << 8;
      iVar7 = getc(__stream);
      Info_h.biBlueMask = Info_h.biBlueMask | iVar7 << 0x10;
      iVar7 = getc(__stream);
      Info_h.biBlueMask = Info_h.biBlueMask | iVar7 << 0x18;
      if (Info_h.biBlueMask == 0) {
        bmptoimage_cold_5();
        goto LAB_0010c346;
      }
      OVar6 = getc(__stream);
      Info_h.biAlphaMask = OVar6;
      iVar7 = getc(__stream);
      Info_h.biAlphaMask = Info_h.biAlphaMask | iVar7 << 8;
      iVar7 = getc(__stream);
      Info_h.biAlphaMask = Info_h.biAlphaMask | iVar7 << 0x10;
      iVar7 = getc(__stream);
      Info_h.biAlphaMask = Info_h.biAlphaMask | iVar7 << 0x18;
      if (0x6b < Info_h.biSize) {
        OVar6 = getc(__stream);
        Info_h.biColorSpaceType = OVar6;
        iVar7 = getc(__stream);
        Info_h.biColorSpaceType = Info_h.biColorSpaceType | iVar7 << 8;
        iVar7 = getc(__stream);
        Info_h.biColorSpaceType = Info_h.biColorSpaceType | iVar7 << 0x10;
        iVar7 = getc(__stream);
        Info_h.biColorSpaceType = Info_h.biColorSpaceType | iVar7 << 0x18;
        sVar8 = fread(Info_h.biColorSpaceEP,1,0x24,__stream);
        if (sVar8 != 0x24) {
          bmptoimage_cold_2();
          goto LAB_0010c346;
        }
        OVar6 = getc(__stream);
        Info_h.biRedGamma = OVar6;
        iVar7 = getc(__stream);
        Info_h.biRedGamma = Info_h.biRedGamma | iVar7 << 8;
        iVar7 = getc(__stream);
        Info_h.biRedGamma = Info_h.biRedGamma | iVar7 << 0x10;
        iVar7 = getc(__stream);
        Info_h.biRedGamma = Info_h.biRedGamma | iVar7 << 0x18;
        OVar6 = getc(__stream);
        Info_h.biGreenGamma = OVar6;
        iVar7 = getc(__stream);
        Info_h.biGreenGamma = Info_h.biGreenGamma | iVar7 << 8;
        iVar7 = getc(__stream);
        Info_h.biGreenGamma = Info_h.biGreenGamma | iVar7 << 0x10;
        iVar7 = getc(__stream);
        Info_h.biGreenGamma = Info_h.biGreenGamma | iVar7 << 0x18;
        Info_h.biBlueGamma = getc(__stream);
        iVar7 = getc(__stream);
        Info_h.biBlueGamma = Info_h.biBlueGamma | iVar7 << 8;
        iVar7 = getc(__stream);
        Info_h.biBlueGamma = Info_h.biBlueGamma | iVar7 << 0x10;
        iVar7 = getc(__stream);
        Info_h.biBlueGamma = Info_h.biBlueGamma | iVar7 << 0x18;
        if (0x7b < Info_h.biSize) {
          Info_h.biIntent = getc(__stream);
          iVar7 = getc(__stream);
          Info_h.biIntent = Info_h.biIntent | iVar7 << 8;
          iVar7 = getc(__stream);
          Info_h.biIntent = Info_h.biIntent | iVar7 << 0x10;
          iVar7 = getc(__stream);
          Info_h.biIntent = Info_h.biIntent | iVar7 << 0x18;
          Info_h.biIccProfileData = getc(__stream);
          iVar7 = getc(__stream);
          Info_h.biIccProfileData = Info_h.biIccProfileData | iVar7 << 8;
          iVar7 = getc(__stream);
          Info_h.biIccProfileData = Info_h.biIccProfileData | iVar7 << 0x10;
          iVar7 = getc(__stream);
          Info_h.biIccProfileData = Info_h.biIccProfileData | iVar7 << 0x18;
          OVar6 = getc(__stream);
          Info_h.biIccProfileSize = OVar6;
          iVar7 = getc(__stream);
          Info_h.biIccProfileSize = Info_h.biIccProfileSize | iVar7 << 8;
          iVar7 = getc(__stream);
          Info_h.biIccProfileSize = Info_h.biIccProfileSize | iVar7 << 0x10;
          iVar7 = getc(__stream);
          Info_h.biIccProfileSize = Info_h.biIccProfileSize | iVar7 << 0x18;
          OVar6 = getc(__stream);
          Info_h.biReserved = OVar6;
          iVar7 = getc(__stream);
          Info_h.biReserved = Info_h.biReserved | iVar7 << 8;
          iVar7 = getc(__stream);
          Info_h.biReserved = Info_h.biReserved | iVar7 << 0x10;
          iVar7 = getc(__stream);
          Info_h.biReserved = Info_h.biReserved | iVar7 << 0x18;
        }
      }
    }
    uVar1 = Info_h.biBitCount;
  }
  OVar6 = (OPJ_UINT32)in_R8;
  if (uVar1 < 9) {
    uVar13 = 0;
    memset(lut_R,0,0x100);
    memset(lut_G,0,0x100);
    memset(lut_B,0,0x100);
    uVar15 = 1 << ((byte)uVar1 & 0x1f);
    if (Info_h.biClrUsed != 0) {
      uVar15 = Info_h.biClrUsed;
    }
    if (0xff < uVar15) {
      uVar15 = 0x100;
    }
    bVar14 = 0;
    do {
      iVar7 = getc(__stream);
      lut_B[uVar13] = (OPJ_UINT8)iVar7;
      iVar7 = getc(__stream);
      lut_G[uVar13] = (OPJ_UINT8)iVar7;
      iVar7 = getc(__stream);
      lut_R[uVar13] = (OPJ_UINT8)iVar7;
      getc(__stream);
      OVar6 = (OPJ_UINT32)in_R8;
      bVar14 = lut_G[uVar13] ^ lut_R[uVar13] | lut_B[uVar13] ^ lut_G[uVar13] | bVar14;
      uVar13 = uVar13 + 1;
    } while (uVar15 + (uVar15 == 0) != uVar13);
    cVar12 = (bVar14 != 0) * '\x02' + '\x01';
  }
  else {
    cVar12 = (Info_h.biAlphaMask != 0 && Info_h.biCompression == 3) + '\x03';
  }
  if (Info_h.biHeight == 0 || Info_h.biWidth == 0) goto LAB_0010c346;
  if ((uint)(0xffffffe0 / (ulong)Info_h.biWidth) < (uint)Info_h.biBitCount) goto LAB_0010c346;
  uVar15 = Info_h.biWidth * Info_h.biBitCount + 0x1f >> 3;
  if ((Info_h.biBitCount == 4) && (Info_h.biCompression == 2)) {
    if (0x1ffffffc < Info_h.biWidth) goto LAB_0010c346;
    uVar15 = Info_h.biWidth + 3;
  }
  uVar15 = uVar15 & 0x1ffffffc;
  if (((int)((Info_h._8_8_ & 0xffffffff) * (ulong)uVar15 >> 0x20) != 0) ||
     (pData = (OPJ_UINT8 *)calloc(1,(ulong)uVar15 * (Info_h._8_8_ & 0xffffffff)),
     pData == (OPJ_UINT8 *)0x0)) goto LAB_0010c346;
  fseek(__stream,0,0);
  fseek(__stream,(ulong)(iVar3 << 8 | uVar2 | iVar5 << 0x18 | iVar4 << 0x10),0);
  switch(Info_h._16_8_ & 0xffffffff) {
  case 0:
  case 3:
    iVar3 = bmp_read_raw_data((FILE *)__stream,pData,uVar15,Info_h.biHeight,OVar6);
    break;
  case 1:
    iVar3 = bmp_read_rle8_data((FILE *)__stream,pData,uVar15,Info_h.biWidth,Info_h.biHeight);
    break;
  case 2:
    iVar3 = bmp_read_rle4_data((FILE *)__stream,pData,uVar15,Info_h.biWidth,Info_h.biHeight);
    break;
  default:
    bmptoimage_cold_4();
    goto LAB_0010c33e;
  }
  if (iVar3 == 0) {
LAB_0010c33e:
    free(pData);
LAB_0010c346:
    fclose(__stream);
    return (opj_image_t *)0x0;
  }
  memset(cmptparm,0,0x90);
  iVar3 = parameters->subsampling_dx;
  iVar4 = parameters->subsampling_dy;
  lVar9 = 0x20;
  do {
    *(undefined8 *)((long)&uStack_3d0 + lVar9) = 0x800000008;
    *(undefined4 *)((long)&cmptparm[0].dx + lVar9) = 0;
    *(int *)((long)pLUT + lVar9) = iVar3;
    *(int *)((long)pLUT + lVar9 + 4) = iVar4;
    *(OPJ_UINT32 *)((long)pLUT + lVar9 + 8) = Info_h.biWidth;
    *(OPJ_UINT32 *)((long)pLUT + lVar9 + 0xc) = Info_h.biHeight;
    lVar9 = lVar9 + 0x24;
  } while (lVar9 != 0xb0);
  image = (opj_image_t *)opj_image_create(cVar12,cmptparm,(cVar12 == '\x01') + '\x01');
  if (image == (opj_image_t *)0x0) {
    fclose(__stream);
    free(pData);
    return (opj_image_t *)0x0;
  }
  if (cVar12 == '\x04') {
    image->comps[3].alpha = 1;
  }
  OVar6 = parameters->image_offset_x0;
  image->x0 = OVar6;
  OVar11 = parameters->image_offset_y0;
  image->y0 = OVar11;
  image->x1 = OVar6 + (Info_h.biWidth - 1) * parameters->subsampling_dx + 1;
  image->y1 = (Info_h.biHeight - 1) * parameters->subsampling_dy + OVar11 + 1;
  if (Info_h.biCompression == 0 && Info_h.biBitCount == 0x18) {
    bmp24toimage(pData,uVar15,(opj_image_t *)image->comps);
  }
  else if (((Info_h.biBitCount == 8 && Info_h.biCompression == 0) ||
           (Info_h.biCompression == 1 && Info_h.biBitCount == 8)) ||
          (Info_h.biCompression == 2 && Info_h.biBitCount == 4)) {
    bmp8toimage(pData,uVar15,image,pLUT);
  }
  else {
    if (Info_h.biBitCount == 0x20 && Info_h.biCompression == 0) {
      uVar2 = image->numcomps;
      OVar10 = (OPJ_UINT32)image->comps;
      OVar6 = 0xff0000;
      OVar11 = 0xff00;
      OVar16 = 0xff;
    }
    else {
      if (Info_h.biCompression != 3 || Info_h.biBitCount != 0x20) {
        if (Info_h.biBitCount == 0x10 && Info_h.biCompression == 0) {
          uVar2 = image->numcomps;
          OVar10 = (OPJ_UINT32)image->comps;
          OVar6 = 0x7c00;
          OVar11 = 0x3e0;
          OVar16 = 0x1f;
        }
        else {
          if ((Info_h.biBitCount != 0x10) || (Info_h.biCompression != 3)) {
            bmptoimage_cold_3();
            image = (opj_image_t *)0x0;
            goto LAB_0010c2da;
          }
          OVar6 = Info_h.biRedMask;
          OVar11 = Info_h.biGreenMask;
          OVar16 = Info_h.biBlueMask;
          if ((Info_h.biRedMask == 0 && Info_h.biGreenMask == 0) && Info_h.biBlueMask == 0) {
            Info_h.biRedMask = 0xf800;
            Info_h.biGreenMask = 0x7e0;
            Info_h.biBlueMask = 0x1f;
            OVar6 = 0xf800;
            OVar11 = 0x7e0;
            OVar16 = 0x1f;
          }
          uVar2 = image->numcomps;
          OVar10 = (OPJ_UINT32)image->comps;
        }
        bmpmask16toimage(pData,uVar15,(opj_image_t *)(ulong)uVar2,OVar10,OVar6,OVar11,OVar16);
        goto LAB_0010c2da;
      }
      OVar6 = Info_h.biRedMask;
      OVar11 = Info_h.biGreenMask;
      OVar16 = Info_h.biBlueMask;
      if ((Info_h.biRedMask == 0 && Info_h.biGreenMask == 0) && Info_h.biBlueMask == 0) {
        Info_h.biRedMask = 0xff0000;
        Info_h.biGreenMask = 0xff00;
        Info_h.biBlueMask = 0xff;
        OVar6 = 0xff0000;
        OVar11 = 0xff00;
        OVar16 = 0xff;
      }
      uVar2 = image->numcomps;
      OVar10 = (OPJ_UINT32)image->comps;
    }
    bmpmask32toimage(pData,uVar15,(opj_image_t *)(ulong)uVar2,OVar10,OVar6,OVar11,OVar16);
  }
LAB_0010c2da:
  free(pData);
  fclose(__stream);
  return image;
}

Assistant:

opj_image_t* bmptoimage(const char *filename, opj_cparameters_t *parameters)
{
    opj_image_cmptparm_t cmptparm[4];   /* maximum of 4 components */
    OPJ_UINT8 lut_R[256], lut_G[256], lut_B[256];
    OPJ_UINT8 const* pLUT[3];
    opj_image_t * image = NULL;
    FILE *IN;
    OPJ_BITMAPFILEHEADER File_h;
    OPJ_BITMAPINFOHEADER Info_h;
    OPJ_UINT32 i, palette_len, numcmpts = 1U;
    OPJ_BOOL l_result = OPJ_FALSE;
    OPJ_UINT8* pData = NULL;
    OPJ_UINT32 stride;

    pLUT[0] = lut_R;
    pLUT[1] = lut_G;
    pLUT[2] = lut_B;

    IN = fopen(filename, "rb");
    if (!IN) {
        fprintf(stderr, "Failed to open %s for reading !!\n", filename);
        return NULL;
    }

    if (!bmp_read_file_header(IN, &File_h)) {
        fclose(IN);
        return NULL;
    }
    if (!bmp_read_info_header(IN, &Info_h)) {
        fclose(IN);
        return NULL;
    }

    /* Load palette */
    if (Info_h.biBitCount <= 8U) {
        memset(&lut_R[0], 0, sizeof(lut_R));
        memset(&lut_G[0], 0, sizeof(lut_G));
        memset(&lut_B[0], 0, sizeof(lut_B));

        palette_len = Info_h.biClrUsed;
        if ((palette_len == 0U) && (Info_h.biBitCount <= 8U)) {
            palette_len = (1U << Info_h.biBitCount);
        }
        if (palette_len > 256U) {
            palette_len = 256U;
        }
        if (palette_len > 0U) {
            OPJ_UINT8 has_color = 0U;
            for (i = 0U; i < palette_len; i++) {
                lut_B[i] = (OPJ_UINT8)getc(IN);
                lut_G[i] = (OPJ_UINT8)getc(IN);
                lut_R[i] = (OPJ_UINT8)getc(IN);
                (void)getc(IN); /* padding */
                has_color |= (lut_B[i] ^ lut_G[i]) | (lut_G[i] ^ lut_R[i]);
            }
            if (has_color) {
                numcmpts = 3U;
            }
        }
    } else {
        numcmpts = 3U;
        if ((Info_h.biCompression == 3) && (Info_h.biAlphaMask != 0U)) {
            numcmpts++;
        }
    }

    if (Info_h.biWidth == 0 || Info_h.biHeight == 0) {
        fclose(IN);
        return NULL;
    }

    if (Info_h.biBitCount > (((OPJ_UINT32) - 1) - 31) / Info_h.biWidth) {
        fclose(IN);
        return NULL;
    }
    stride = ((Info_h.biWidth * Info_h.biBitCount + 31U) / 32U) *
             4U; /* rows are aligned on 32bits */
    if (Info_h.biBitCount == 4 &&
            Info_h.biCompression == 2) { /* RLE 4 gets decoded as 8 bits data for now... */
        if (8 > (((OPJ_UINT32) - 1) - 31) / Info_h.biWidth) {
            fclose(IN);
            return NULL;
        }
        stride = ((Info_h.biWidth * 8U + 31U) / 32U) * 4U;
    }

    if (stride > ((OPJ_UINT32) - 1) / sizeof(OPJ_UINT8) / Info_h.biHeight) {
        fclose(IN);
        return NULL;
    }
    pData = (OPJ_UINT8 *) calloc(1, sizeof(OPJ_UINT8) * stride * Info_h.biHeight);
    if (pData == NULL) {
        fclose(IN);
        return NULL;
    }
    /* Place the cursor at the beginning of the image information */
    fseek(IN, 0, SEEK_SET);
    fseek(IN, (long)File_h.bfOffBits, SEEK_SET);

    switch (Info_h.biCompression) {
    case 0:
    case 3:
        /* read raw data */
        l_result = bmp_read_raw_data(IN, pData, stride, Info_h.biWidth,
                                     Info_h.biHeight);
        break;
    case 1:
        /* read rle8 data */
        l_result = bmp_read_rle8_data(IN, pData, stride, Info_h.biWidth,
                                      Info_h.biHeight);
        break;
    case 2:
        /* read rle4 data */
        l_result = bmp_read_rle4_data(IN, pData, stride, Info_h.biWidth,
                                      Info_h.biHeight);
        break;
    default:
        fprintf(stderr, "Unsupported BMP compression\n");
        l_result = OPJ_FALSE;
        break;
    }
    if (!l_result) {
        free(pData);
        fclose(IN);
        return NULL;
    }

    /* create the image */
    memset(&cmptparm[0], 0, sizeof(cmptparm));
    for (i = 0; i < 4U; i++) {
        cmptparm[i].prec = 8;
        cmptparm[i].bpp  = 8;
        cmptparm[i].sgnd = 0;
        cmptparm[i].dx   = (OPJ_UINT32)parameters->subsampling_dx;
        cmptparm[i].dy   = (OPJ_UINT32)parameters->subsampling_dy;
        cmptparm[i].w    = Info_h.biWidth;
        cmptparm[i].h    = Info_h.biHeight;
    }

    image = opj_image_create(numcmpts, &cmptparm[0],
                             (numcmpts == 1U) ? OPJ_CLRSPC_GRAY : OPJ_CLRSPC_SRGB);
    if (!image) {
        fclose(IN);
        free(pData);
        return NULL;
    }
    if (numcmpts == 4U) {
        image->comps[3].alpha = 1;
    }

    /* set image offset and reference grid */
    image->x0 = (OPJ_UINT32)parameters->image_offset_x0;
    image->y0 = (OPJ_UINT32)parameters->image_offset_y0;
    image->x1 = image->x0 + (Info_h.biWidth  - 1U) * (OPJ_UINT32)
                parameters->subsampling_dx + 1U;
    image->y1 = image->y0 + (Info_h.biHeight - 1U) * (OPJ_UINT32)
                parameters->subsampling_dy + 1U;

    /* Read the data */
    if (Info_h.biBitCount == 24 && Info_h.biCompression == 0) { /*RGB */
        bmp24toimage(pData, stride, image);
    } else if (Info_h.biBitCount == 8 &&
               Info_h.biCompression == 0) { /* RGB 8bpp Indexed */
        bmp8toimage(pData, stride, image, pLUT);
    } else if (Info_h.biBitCount == 8 && Info_h.biCompression == 1) { /*RLE8*/
        bmp8toimage(pData, stride, image, pLUT);
    } else if (Info_h.biBitCount == 4 && Info_h.biCompression == 2) { /*RLE4*/
        bmp8toimage(pData, stride, image,
                    pLUT); /* RLE 4 gets decoded as 8 bits data for now */
    } else if (Info_h.biBitCount == 32 && Info_h.biCompression == 0) { /* RGBX */
        bmpmask32toimage(pData, stride, image, 0x00FF0000U, 0x0000FF00U, 0x000000FFU,
                         0x00000000U);
    } else if (Info_h.biBitCount == 32 && Info_h.biCompression == 3) { /* bitmask */
        if ((Info_h.biRedMask == 0U) && (Info_h.biGreenMask == 0U) &&
                (Info_h.biBlueMask == 0U)) {
            Info_h.biRedMask   = 0x00FF0000U;
            Info_h.biGreenMask = 0x0000FF00U;
            Info_h.biBlueMask  = 0x000000FFU;
        }
        bmpmask32toimage(pData, stride, image, Info_h.biRedMask, Info_h.biGreenMask,
                         Info_h.biBlueMask, Info_h.biAlphaMask);
    } else if (Info_h.biBitCount == 16 && Info_h.biCompression == 0) { /* RGBX */
        bmpmask16toimage(pData, stride, image, 0x7C00U, 0x03E0U, 0x001FU, 0x0000U);
    } else if (Info_h.biBitCount == 16 && Info_h.biCompression == 3) { /* bitmask */
        if ((Info_h.biRedMask == 0U) && (Info_h.biGreenMask == 0U) &&
                (Info_h.biBlueMask == 0U)) {
            Info_h.biRedMask   = 0xF800U;
            Info_h.biGreenMask = 0x07E0U;
            Info_h.biBlueMask  = 0x001FU;
        }
        bmpmask16toimage(pData, stride, image, Info_h.biRedMask, Info_h.biGreenMask,
                         Info_h.biBlueMask, Info_h.biAlphaMask);
    } else {
        opj_image_destroy(image);
        image = NULL;
        fprintf(stderr,
                "Other system than 24 bits/pixels or 8 bits (no RLE coding) is not yet implemented [%d]\n",
                Info_h.biBitCount);
    }
    free(pData);
    fclose(IN);
    return image;
}